

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_crypt_ctr
              (mbedtls_aes_context *ctx,size_t length,size_t *nc_off,uchar *nonce_counter,
              uchar *stream_block,uchar *input,uchar *output)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  
  sVar5 = *nc_off;
  do {
    bVar6 = length == 0;
    length = length - 1;
    if (bVar6) {
      *nc_off = sVar5;
      return 0;
    }
    if (sVar5 == 0) {
      mbedtls_aes_crypt_ecb(ctx,1,nonce_counter,stream_block);
      uVar4 = 0x10;
      uVar3 = 0x10;
      do {
        bVar6 = uVar3 == 0;
        uVar3 = uVar3 - 1;
        if (bVar6) break;
        puVar1 = nonce_counter + (uVar4 - 1);
        *puVar1 = *puVar1 + '\x01';
        uVar4 = (ulong)uVar3;
      } while (*puVar1 == '\0');
    }
    bVar2 = *input;
    input = input + 1;
    *output = stream_block[sVar5] ^ bVar2;
    output = output + 1;
    sVar5 = (size_t)((int)sVar5 + 1U & 0xf);
  } while( true );
}

Assistant:

int mbedtls_aes_crypt_ctr( mbedtls_aes_context *ctx,
                       size_t length,
                       size_t *nc_off,
                       unsigned char nonce_counter[16],
                       unsigned char stream_block[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c, i;
    size_t n = *nc_off;

    while( length-- )
    {
        if( n == 0 ) {
            mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, nonce_counter, stream_block );

            for( i = 16; i > 0; i-- )
                if( ++nonce_counter[i - 1] != 0 )
                    break;
        }
        c = *input++;
        *output++ = (unsigned char)( c ^ stream_block[n] );

        n = ( n + 1 ) & 0x0F;
    }

    *nc_off = n;

    return( 0 );
}